

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

bool __thiscall FTraceInfo::ThingCheck(FTraceInfo *this,intercept_t *in,double dist,DVector3 *hit)

{
  AActor *pAVar1;
  sector_t_conflict *psVar2;
  FTraceResults *pFVar3;
  bool bVar4;
  ETraceStatus EVar5;
  long lVar6;
  ETraceResult EVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar11 = hit->Z;
  dVar9 = (((in->d).thing)->__Pos).Z;
  dVar10 = ((in->d).thing)->Height + dVar9;
  if (dVar11 <= dVar10) {
    if (dVar11 < dVar9) {
      dVar10 = (this->Vec).Z;
      if (dVar10 <= 0.0) {
        return true;
      }
      dVar11 = (this->Start).Z;
      dist = (dVar9 - dVar11) / dVar10;
      if (this->MaxDist < dist) {
        return true;
      }
      in->frac = dist / this->MaxDist;
      dVar11 = dVar11 + dVar10 * dist;
      goto LAB_0045e8b0;
    }
    dVar9 = hit->X;
  }
  else {
    dVar9 = (this->Vec).Z;
    if (0.0 <= dVar9) {
      return true;
    }
    dVar11 = (this->Start).Z;
    dist = (dVar10 - dVar11) / dVar9;
    if (this->MaxDist < dist) {
      return true;
    }
    in->frac = dist / this->MaxDist;
    dVar11 = dVar11 + dVar9 * dist;
LAB_0045e8b0:
    hit->Z = dVar11;
    dVar9 = dist * (this->Vec).X + (this->Start).X;
    dVar10 = dist * (this->Vec).Y + (this->Start).Y;
    hit->X = dVar9;
    hit->Y = dVar10;
    pAVar1 = (in->d).thing;
    if (pAVar1->radius < ABS(dVar9 - (pAVar1->__Pos).X)) {
      return true;
    }
    if (pAVar1->radius < ABS(dVar10 - (pAVar1->__Pos).Y)) {
      return true;
    }
  }
  psVar2 = this->CurSector;
  if ((psVar2->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
    if ((dVar11 <= ((psVar2->ceilingplane).normal.Y * hit->Y +
                   (psVar2->ceilingplane).D + (psVar2->ceilingplane).normal.X * dVar9) *
                   (psVar2->ceilingplane).negiC) || ((psVar2->planes[1].Flags & 0x1d0U) == 0x100)) {
      if (((hit->Y * (psVar2->floorplane).normal.Y +
           (psVar2->floorplane).normal.X * dVar9 + (psVar2->floorplane).D) *
           (psVar2->floorplane).negiC <= dVar11) || ((psVar2->planes[0].Flags & 0x1d0U) == 0x100))
      goto LAB_0045ea87;
      lVar8 = 0xb0;
      lVar6 = 0x48;
      EVar7 = TRACE_HitFloor;
    }
    else {
      lVar8 = 0xd8;
      lVar6 = 0xa0;
      EVar7 = TRACE_HitCeiling;
    }
    pFVar3 = this->Results;
    pFVar3->HitType = EVar7;
    (pFVar3->HitTexture).texnum = *(int *)((long)&psVar2->planes[0].xform.xOffs + lVar6);
    pFVar3->Sector = (sector_t *)(sectors + psVar2->sectornum);
    bVar4 = CheckPlane(this,(secplane_t *)((long)&psVar2->planes[0].xform.xOffs + lVar8));
    if (!bVar4) {
      this->Results->HitType = TRACE_HitNone;
    }
    if (this->TraceCallback == (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) {
      return false;
    }
    EVar5 = (*this->TraceCallback)(this->Results,this->TraceCallbackData);
    switch(EVar5) {
    case TRACE_Stop:
      goto switchD_0045ea67_caseD_0;
    case TRACE_Continue:
      return true;
    case TRACE_Skip:
      this->Results->HitType = TRACE_HitNone;
      return true;
    case TRACE_Abort:
      goto switchD_0045ea67_caseD_3;
    default:
      dVar9 = hit->X;
      dVar11 = hit->Z;
    }
  }
LAB_0045ea87:
  pFVar3 = this->Results;
  pFVar3->HitType = TRACE_HitActor;
  (pFVar3->HitPos).Z = dVar11;
  (pFVar3->HitPos).Y = hit->Y;
  (pFVar3->HitPos).X = dVar9;
  SetSourcePosition(this);
  pFVar3 = this->Results;
  pFVar3->Distance = dist;
  pFVar3->Fraction = in->frac;
  pFVar3->Actor = (AActor *)in->d;
  if ((this->TraceCallback != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0) &&
     (EVar5 = (*this->TraceCallback)(pFVar3,this->TraceCallbackData), EVar5 != TRACE_Stop)) {
    if (EVar5 == TRACE_Skip) {
      this->Results->HitType = TRACE_HitNone;
      return true;
    }
    if (EVar5 != TRACE_Abort) {
      return true;
    }
switchD_0045ea67_caseD_3:
    this->Results->HitType = TRACE_HitNone;
  }
switchD_0045ea67_caseD_0:
  return false;
}

Assistant:

bool FTraceInfo::ThingCheck(intercept_t *in, double dist, DVector3 hit)
{
	if (hit.Z > in->d.thing->Top())
	{
		// trace enters above actor
		if (Vec.Z >= 0) return true;      // Going up: can't hit

		// Does it hit the top of the actor?
		dist = (in->d.thing->Top() - Start.Z) / Vec.Z;

		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}
	else if (hit.Z < in->d.thing->Z())
	{ // trace enters below actor
		if (Vec.Z <= 0) return true;      // Going down: can't hit

		// Does it hit the bottom of the actor?
		dist = (in->d.thing->Z() - Start.Z) / Vec.Z;
		if (dist > MaxDist) return true;
		in->frac = dist / MaxDist;

		hit = Start + Vec * dist;

		// calculated coordinate is outside the actor's bounding box
		if (fabs(hit.X - in->d.thing->X()) > in->d.thing->radius ||
			fabs(hit.Y - in->d.thing->Y()) > in->d.thing->radius) return true;
	}

	if (CurSector->e->XFloor.ffloors.Size())
	{
		// check for 3D floor hits first.
		double ff_floor = CurSector->floorplane.ZatPoint(hit);
		double ff_ceiling = CurSector->ceilingplane.ZatPoint(hit);

		if (hit.Z > ff_ceiling && CurSector->PortalBlocksMovement(sector_t::ceiling))	// actor is hit above the current ceiling
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
		else if (hit.Z < ff_floor && CurSector->PortalBlocksMovement(sector_t::floor))	// actor is hit below the current floor
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else goto cont1;

		// the trace hit a 3D floor before the thing.
		// Calculate an intersection and abort.
		Results->Sector = &sectors[CurSector->sectornum];
		if (!CheckSectorPlane(CurSector, Results->HitType == TRACE_HitFloor))
		{
			Results->HitType = TRACE_HitNone;
		}
		if (TraceCallback != NULL)
		{
			switch (TraceCallback(*Results, TraceCallbackData))
			{
			case TRACE_Continue: return true;
			case TRACE_Stop:	 return false;
			case TRACE_Abort:	 Results->HitType = TRACE_HitNone; return false;
			case TRACE_Skip:	 Results->HitType = TRACE_HitNone; return true;
			}
		}
		else
		{
			return false;
		}
	}
cont1:


	Results->HitType = TRACE_HitActor;
	Results->HitPos = hit;
	SetSourcePosition();
	Results->Distance = dist;
	Results->Fraction = in->frac;
	Results->Actor = in->d.thing;

	if (TraceCallback != NULL)
	{
		switch (TraceCallback(*Results, TraceCallbackData))
		{
		case TRACE_Stop:	return false;
		case TRACE_Abort:	Results->HitType = TRACE_HitNone; return false;
		case TRACE_Skip:	Results->HitType = TRACE_HitNone; return true;
		default:			return true;
		}
	}
	else
	{
		return false;
	}
}